

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O1

djpeg_dest_ptr jinit_write_gif(j_decompress_ptr cinfo,boolean is_lzw)

{
  jpeg_error_mgr *pjVar1;
  djpeg_dest_ptr pdVar2;
  JSAMPARRAY ppJVar3;
  void *pvVar4;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var5;
  
  pdVar2 = (djpeg_dest_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x180);
  pdVar2[1].start_output = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)cinfo;
  pdVar2->start_output = start_output_gif;
  pdVar2->finish_output = finish_output_gif;
  pdVar2->calc_buffer_dimensions = calc_buffer_dimensions_gif;
  if (1 < cinfo->out_color_space - JCS_GRAYSCALE) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x3f8;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  if (((cinfo->out_color_space != JCS_GRAYSCALE) || (8 < cinfo->data_precision)) &&
     (cinfo->quantize_colors = 1, 0x100 < cinfo->desired_number_of_colors)) {
    cinfo->desired_number_of_colors = 0x100;
  }
  jpeg_calc_output_dimensions(cinfo);
  if (cinfo->output_components != 1) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x3f6;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  ppJVar3 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,cinfo->output_width,1);
  pdVar2->buffer = ppJVar3;
  pdVar2->buffer_height = 1;
  if (is_lzw == 0) {
    pdVar2->put_pixel_rows = put_raw_pixel_rows;
    *(undefined8 *)&pdVar2[1].buffer_height = 0;
    pdVar2[2].start_output = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)0x0;
  }
  else {
    pdVar2->put_pixel_rows = put_LZW_pixel_rows;
    pvVar4 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x2716);
    *(void **)&pdVar2[1].buffer_height = pvVar4;
    p_Var5 = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)
             (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x4e2c);
    pdVar2[2].start_output = p_Var5;
  }
  return pdVar2;
}

Assistant:

GLOBAL(djpeg_dest_ptr)
jinit_write_gif(j_decompress_ptr cinfo, boolean is_lzw)
{
  gif_dest_ptr dest;

  /* Create module interface object, fill in method pointers */
  dest = (gif_dest_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(gif_dest_struct));
  dest->cinfo = cinfo;          /* make back link for subroutines */
  dest->pub.start_output = start_output_gif;
  dest->pub.finish_output = finish_output_gif;
  dest->pub.calc_buffer_dimensions = calc_buffer_dimensions_gif;

  if (cinfo->out_color_space != JCS_GRAYSCALE &&
      cinfo->out_color_space != JCS_RGB)
    ERREXIT(cinfo, JERR_GIF_COLORSPACE);

  /* Force quantization if color or if > 8 bits input */
  if (cinfo->out_color_space != JCS_GRAYSCALE || cinfo->data_precision > 8) {
    /* Force quantization to at most 256 colors */
    cinfo->quantize_colors = TRUE;
    if (cinfo->desired_number_of_colors > 256)
      cinfo->desired_number_of_colors = 256;
  }

  /* Calculate output image dimensions so we can allocate space */
  jpeg_calc_output_dimensions(cinfo);

  if (cinfo->output_components != 1) /* safety check: just one component? */
    ERREXIT(cinfo, JERR_GIF_BUG);

  /* Create decompressor output buffer. */
  dest->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, cinfo->output_width, (JDIMENSION)1);
  dest->pub.buffer_height = 1;

  if (is_lzw) {
    dest->pub.put_pixel_rows = put_LZW_pixel_rows;
    /* Allocate space for hash table */
    dest->hash_code = (code_int *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  HSIZE * sizeof(code_int));
    dest->hash_value = (hash_entry *)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  HSIZE * sizeof(hash_entry));
  } else {
    dest->pub.put_pixel_rows = put_raw_pixel_rows;
    /* Mark tables unused */
    dest->hash_code = NULL;
    dest->hash_value = NULL;
  }

  return (djpeg_dest_ptr)dest;
}